

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlibversion.h
# Opt level: O3

string * __thiscall trun::Version::AsString_abi_cxx11_(string *__return_storage_ptr__,Version *this)

{
  size_t sVar1;
  char buffer [32];
  char acStack_38 [40];
  
  snprintf(acStack_38,0x1f,"%d.%d.%d",(ulong)(this->data).ver.major,(ulong)(this->data).ver.minor,
           (ulong)(this->data).ver.patch);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(acStack_38);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_38,acStack_38 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

const std::string AsString() const {
            char buffer[32];
            snprintf(buffer,31,"%d.%d.%d", data.ver.major, data.ver.minor, data.ver.patch);
            return std::string(buffer);
        }